

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerWrite(PgHdr *pPg)

{
  Pgno PVar1;
  uint uVar2;
  uint uVar3;
  Pager *pPVar4;
  sqlite3_file *psVar5;
  sqlite3_vfs *psVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  int iVar12;
  DbPage *pPg_00;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  u32 i;
  long lVar17;
  uint pgno;
  int iVar18;
  int *piVar19;
  long in_FS_OFFSET;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uStack_40;
  long lStack_38;
  
  pPVar4 = pPg->pPager;
  if (((pPg->flags & 4) != 0) && (pPg->pgno <= pPVar4->dbSize)) {
    if (pPVar4->nSavepoint == 0) {
      return 0;
    }
    lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
    pPVar4 = pPg->pPager;
    iVar12 = pPVar4->nSavepoint;
    lVar16 = (long)iVar12;
    if (0 < lVar16) {
      uVar2 = pPg->pgno;
      piVar19 = &pPVar4->aSavepoint[4].bTruncateOnRelease;
      lVar17 = 0;
      do {
        if ((uVar2 <= (uint)piVar19[-0x3a]) &&
           (iVar15 = sqlite3BitvecTestNotNull(*(Bitvec **)(piVar19 + -0x3c),uVar2),
           auVar10 = _DAT_002010a0, auVar9 = _DAT_00201090, auVar8 = _DAT_00201080, iVar15 == 0)) {
          if (1 - (int)lVar17 < iVar12) {
            lVar13 = lVar16 + lVar17 + -2;
            auVar20._8_4_ = (int)lVar13;
            auVar20._0_8_ = lVar13;
            auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
            uVar14 = 0;
            auVar20 = auVar20 ^ _DAT_002010a0;
            do {
              auVar21._8_4_ = (int)uVar14;
              auVar21._0_8_ = uVar14;
              auVar21._12_4_ = (int)(uVar14 >> 0x20);
              auVar22 = (auVar21 | auVar9) ^ auVar10;
              iVar12 = auVar20._4_4_;
              if ((bool)(~(auVar22._4_4_ == iVar12 && auVar20._0_4_ < auVar22._0_4_ ||
                          iVar12 < auVar22._4_4_) & 1)) {
                piVar19[-0x2a] = 0;
              }
              if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
                  auVar22._12_4_ <= auVar20._12_4_) {
                piVar19[-0x1c] = 0;
              }
              auVar21 = (auVar21 | auVar8) ^ auVar10;
              iVar15 = auVar21._4_4_;
              if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar21._0_4_ <= auVar20._0_4_)) {
                piVar19[-0xe] = 0;
                *piVar19 = 0;
              }
              uVar14 = uVar14 + 4;
              piVar19 = piVar19 + 0x38;
            } while ((lVar16 + lVar17 + 2U & 0xfffffffffffffffc) != uVar14);
          }
          iVar12 = 0;
          if (pPVar4->journalMode != '\x02') {
            psVar5 = pPVar4->sjfd;
            iVar12 = 0;
            if (psVar5->pMethods == (sqlite3_io_methods *)0x0) {
              if ((pPVar4->journalMode == '\x04') ||
                 (iVar15 = sqlite3Config.nStmtSpill, pPVar4->subjInMemory != '\0')) {
                iVar15 = -1;
              }
              psVar6 = pPVar4->pVfs;
              *(undefined1 (*) [16])(psVar5 + 8) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(psVar5 + 6) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(psVar5 + 4) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(psVar5 + 2) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])psVar5 = (undefined1  [16])0x0;
              if (iVar15 == 0) {
                iVar12 = (*psVar6->xOpen)((sqlite3_file *)psVar6,0);
              }
              else {
                iVar18 = 0x3f8;
                if (0 < iVar15) {
                  iVar18 = iVar15;
                }
                *(int *)&psVar5[1].pMethods = iVar18;
                psVar5->pMethods = &MemJournalMethods;
                *(int *)((long)&psVar5[1].pMethods + 4) = iVar15;
                *(undefined4 *)&psVar5[7].pMethods = 0x201e;
                psVar5[9].pMethods = (sqlite3_io_methods *)0x0;
                psVar5[8].pMethods = (sqlite3_io_methods *)psVar6;
              }
            }
            if (iVar12 == 0) {
              pvVar7 = pPg->pData;
              lVar16 = (pPVar4->pageSize + 4) * (ulong)pPVar4->nSubRec;
              PVar1 = pPg->pgno;
              uStack_40 = (DbPage *)
                          CONCAT17((char)PVar1,
                                   CONCAT16((char)(PVar1 >> 8),
                                            CONCAT15((char)(PVar1 >> 0x10),
                                                     CONCAT14((char)(PVar1 >> 0x18),(int)uStack_40))
                                           ));
              iVar12 = (*pPVar4->sjfd->pMethods->xWrite)
                                 (pPVar4->sjfd,(void *)((long)&uStack_40 + 4),4,lVar16);
              if (iVar12 == 0) {
                iVar12 = (*pPVar4->sjfd->pMethods->xWrite)
                                   (pPVar4->sjfd,pvVar7,(int)pPVar4->pageSize,lVar16 + 4);
              }
            }
          }
          if (iVar12 == 0) {
            pPVar4->nSubRec = pPVar4->nSubRec + 1;
            iVar12 = addToSavepointBitvecs(pPVar4,pPg->pgno);
          }
          goto LAB_00136815;
        }
        piVar19 = piVar19 + 0xe;
        lVar17 = lVar17 + -1;
      } while (lVar16 + lVar17 != 0);
    }
    iVar12 = 0;
LAB_00136815:
    if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
      return iVar12;
    }
    __stack_chk_fail();
  }
  if (pPVar4->errCode != 0) {
    return pPVar4->errCode;
  }
  if (pPVar4->sectorSize <= (uint)pPVar4->pageSize) {
    iVar12 = pager_write(pPg);
    return iVar12;
  }
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar4 = pPg->pPager;
  uVar2 = pPVar4->dbSize;
  pPVar4->doNotSpill = pPVar4->doNotSpill | 4;
  uVar3 = pPg->pgno;
  iVar12 = SUB164(ZEXT416(pPVar4->sectorSize) / SEXT816(pPVar4->pageSize),0);
  pgno = -iVar12 & uVar3 - 1;
  if (uVar2 < uVar3) {
    iVar15 = uVar3 - pgno;
  }
  else {
    iVar15 = uVar2 - pgno;
    if (pgno + iVar12 <= uVar2) {
      iVar15 = iVar12;
    }
  }
  if (iVar15 < 1) {
    iVar12 = 0;
    bVar11 = false;
  }
  else {
    bVar11 = false;
    iVar18 = 1;
    do {
      i = pgno + iVar18;
      uStack_40 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
      if (((i == pPg->pgno) || (pPVar4->pInJournal == (Bitvec *)0x0)) ||
         (iVar12 = sqlite3BitvecTestNotNull(pPVar4->pInJournal,i), iVar12 == 0)) {
        iVar12 = 0;
        if ((i != pPVar4->lckPgno) &&
           (iVar12 = (*pPVar4->xGet)(pPVar4,i,(DbPage **)&uStack_40,0), iVar12 == 0)) {
          iVar12 = pager_write(uStack_40);
          if ((uStack_40->flags & 8) != 0) {
            bVar11 = true;
          }
          goto LAB_0013f8f6;
        }
      }
      else {
        uStack_40 = sqlite3PagerLookup(pPVar4,i);
        iVar12 = 0;
        if (uStack_40 != (DbPage *)0x0) {
          iVar12 = 0;
          if ((uStack_40->flags & 8) != 0) {
            bVar11 = true;
          }
LAB_0013f8f6:
          sqlite3PagerUnrefNotNull(uStack_40);
        }
      }
    } while ((iVar18 < iVar15) && (iVar18 = iVar18 + 1, iVar12 == 0));
    bVar11 = bVar11 && iVar12 == 0;
  }
  if ((bVar11) && (0 < iVar15)) {
    do {
      pgno = pgno + 1;
      pPg_00 = sqlite3PagerLookup(pPVar4,pgno);
      if (pPg_00 != (DbPage *)0x0) {
        *(byte *)&pPg_00->flags = (byte)pPg_00->flags | 8;
        sqlite3PagerUnrefNotNull(pPg_00);
      }
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  pPVar4->doNotSpill = pPVar4->doNotSpill & 0xfb;
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
    return iVar12;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  assert( (pPg->flags & PGHDR_MMAP)==0 );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  if( (pPg->flags & PGHDR_WRITEABLE)!=0 && pPager->dbSize>=pPg->pgno ){
    if( pPager->nSavepoint ) return subjournalPageIfRequired(pPg);
    return SQLITE_OK;
  }else if( pPager->errCode ){
    return pPager->errCode;
  }else if( pPager->sectorSize > (u32)pPager->pageSize ){
    assert( pPager->tempFile==0 );
    return pagerWriteLargeSector(pPg);
  }else{
    return pager_write(pPg);
  }
}